

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O0

void absl::anon_unknown_0::AppendNumberUnit(string *out,double n,DisplayUnit unit)

{
  int *piVar1;
  long v;
  const_pointer __s;
  double dVar2;
  size_type in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  char *bp;
  int64_t int_part;
  int64_t frac_part;
  double d;
  char *ep;
  char buf [15];
  int prec;
  int kBufferSize;
  double n_local;
  string *out_local;
  
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&unit;
  buf[0xb] = '\x0f';
  buf[0xc] = '\0';
  buf[0xd] = '\0';
  buf[0xe] = '\0';
  piVar1 = std::min<int>((int *)(buf + 0xb),&unit.prec);
  buf._7_4_ = *piVar1;
  d = (double)(buf + 7);
  frac_part = 0;
  dVar2 = modf(n,(double *)&frac_part);
  dVar2 = Round<double>(dVar2 * *(double *)((long)&this->field_2 + 8));
  v = (long)dVar2;
  if (((long)(double)frac_part != 0) || (v != 0)) {
    Format64((char *)d,0,(long)(double)frac_part);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (this,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    if (v != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (this,(char)((ulong)in_stack_ffffffffffffff98 >> 0x38));
      Format64((char *)d,buf._7_4_,v);
      for (; *(char *)((long)d + -1) == '0'; d = (double)((long)d + -1)) {
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (this,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    }
    __s = std::basic_string_view<char,_std::char_traits<char>_>::data
                    ((basic_string_view<char,_std::char_traits<char>_> *)this);
    std::basic_string_view<char,_std::char_traits<char>_>::size
              ((basic_string_view<char,_std::char_traits<char>_> *)this);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (this,__s,(size_type)out);
  }
  return;
}

Assistant:

void AppendNumberUnit(std::string* out, double n, DisplayUnit unit) {
  constexpr int kBufferSize = std::numeric_limits<double>::digits10;
  const int prec = std::min(kBufferSize, unit.prec);
  char buf[kBufferSize];  // also large enough to hold integer part
  char* ep = buf + sizeof(buf);
  double d = 0;
  int64_t frac_part = Round(std::modf(n, &d) * unit.pow10);
  int64_t int_part = d;
  if (int_part != 0 || frac_part != 0) {
    char* bp = Format64(ep, 0, int_part);  // always < 1000
    out->append(bp, ep - bp);
    if (frac_part != 0) {
      out->push_back('.');
      bp = Format64(ep, prec, frac_part);
      while (ep[-1] == '0') --ep;
      out->append(bp, ep - bp);
    }
    out->append(unit.abbr.data(), unit.abbr.size());
  }
}